

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffs.c
# Opt level: O0

unsigned_long quick_get_ulong(FMFieldPtr iofield,void *data)

{
  ulong *puVar1;
  anon_union_8_2_1324217a u;
  void *data_local;
  FMFieldPtr iofield_local;
  ulong local_8;
  
  puVar1 = (ulong *)((long)data + iofield->offset);
  switch(iofield->size) {
  case 1:
    local_8 = (ulong)(byte)*puVar1;
    break;
  case 2:
    local_8 = (ulong)(ushort)*puVar1;
    break;
  default:
    local_8 = 0;
    break;
  case 4:
    local_8 = (ulong)(uint)*puVar1;
    break;
  case 8:
    if (((ulong)puVar1 & 0xf) == 0) {
      local_8 = *puVar1;
    }
    else {
      local_8 = *puVar1;
    }
  }
  return local_8;
}

Assistant:

static size_t
quick_get_ulong(FMFieldPtr iofield, void *data)
{
    data = (void *) ((char *) data + iofield->offset);
    /* only used when field type is an integer and aligned by its size */
    switch (iofield->size) {
    case 1:
	return (unsigned long) (*((unsigned char *) data));
    case 2:
	return (unsigned long) (*((unsigned short *) data));
    case 4:
	return (unsigned long) (*((unsigned int *) data));
    case 8:
#if SIZEOF_LONG == 8
	if ((((long) data) & 0x0f) == 0) {
	    /* properly aligned */
	    return (unsigned long) (*((unsigned long *) data));
	} else {
	    union {
		unsigned long tmp;
		int tmpi[2];
	    } u;
	    u.tmpi[0] = ((int *) data)[0];
	    u.tmpi[1] = ((int *) data)[1];
	    return u.tmp;
	}
#else
	/* must be fetching 4 bytes of the 8 available */
	if (WORDS_BIGENDIAN)
	    return (*(((unsigned long *) data) +1));
	else
	    return (*((unsigned long *) data));

#endif
    }
    return 0;
}